

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O3

int __thiscall TPZMatrix<Fad<float>_>::VerifySymmetry(TPZMatrix<Fad<float>_> *this,REAL tol)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  ostream *poVar4;
  float *pfVar5;
  float *pfVar6;
  ulong uVar7;
  float *pfVar8;
  float *pfVar9;
  long lVar10;
  Fad<float> exp;
  long local_c8;
  long local_c0;
  Fad<float> local_a8;
  Fad<float> local_88;
  long local_68;
  undefined8 local_60;
  REAL local_58;
  Fad<float> local_50;
  
  local_68 = (this->super_TPZBaseMatrix).fRow;
  uVar3 = 0;
  if (local_68 == (this->super_TPZBaseMatrix).fCol) {
    if (local_68 < 1) {
      local_60 = 1;
    }
    else {
      local_c0 = 1;
      local_60 = 0;
      local_c8 = 0;
      local_58 = tol;
      do {
        lVar10 = 0;
        do {
          (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x21])
                    (&local_88,this,local_c8,lVar10);
          (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x21])
                    (&local_50,this,lVar10,local_c8);
          iVar2 = local_50.dx_.num_elts;
          iVar1 = local_88.dx_.num_elts;
          local_a8.val_ = local_88.val_ - local_50.val_;
          uVar3 = local_50.dx_.num_elts;
          if (local_50.dx_.num_elts < local_88.dx_.num_elts) {
            uVar3 = local_88.dx_.num_elts;
          }
          local_a8.dx_.num_elts = 0;
          local_a8.dx_.ptr_to_data = (float *)0x0;
          if (0 < (int)uVar3) {
            local_a8.dx_.num_elts = uVar3;
            local_a8.dx_.ptr_to_data = (float *)operator_new__((ulong)uVar3 * 4);
            uVar7 = 0;
            pfVar5 = local_88.dx_.ptr_to_data;
            pfVar6 = local_50.dx_.ptr_to_data;
            do {
              pfVar8 = pfVar5;
              if (iVar1 == 0) {
                pfVar8 = &local_88.defaultVal;
              }
              pfVar9 = pfVar6;
              if (iVar2 == 0) {
                pfVar9 = &local_50.defaultVal;
              }
              local_a8.dx_.ptr_to_data[uVar7] = *pfVar8 - *pfVar9;
              uVar7 = uVar7 + 1;
              pfVar6 = pfVar6 + 1;
              pfVar5 = pfVar5 + 1;
            } while (uVar3 != uVar7);
          }
          local_a8.defaultVal = 0.0;
          Fad<float>::~Fad(&local_50);
          Fad<float>::~Fad(&local_88);
          if (local_58 < (double)ABS(local_a8.val_)) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"Elemento: ",10);
            poVar4 = std::ostream::_M_insert<long>((long)&std::cout);
            std::__ostream_insert<char,std::char_traits<char>>(poVar4,", ",2);
            poVar4 = std::ostream::_M_insert<long>((long)poVar4);
            std::__ostream_insert<char,std::char_traits<char>>(poVar4,"  -> ",5);
            poVar4 = ::operator<<(poVar4,&local_a8);
            std::__ostream_insert<char,std::char_traits<char>>(poVar4,"/",1);
            (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x21])
                      (&local_88,this,local_c8,lVar10);
            poVar4 = ::operator<<(poVar4,&local_88);
            std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
            std::ostream::put((char)poVar4);
            std::ostream::flush();
            Fad<float>::~Fad(&local_88);
            Fad<float>::~Fad(&local_a8);
            goto LAB_00c81623;
          }
          Fad<float>::~Fad(&local_a8);
          lVar10 = lVar10 + 1;
        } while (lVar10 != local_c0);
        local_c8 = local_c8 + 1;
        local_c0 = local_c0 + 1;
        local_60 = CONCAT71((int7)((ulong)local_68 >> 8),local_68 <= local_c8);
      } while (local_c8 != local_68);
    }
LAB_00c81623:
    uVar3 = (uint)local_60 & 1;
  }
  return uVar3;
}

Assistant:

int TPZMatrix<TVar>::VerifySymmetry(REAL tol) const{
	int64_t nrows = this->Rows();
	int64_t ncols = this->Cols();
	if (nrows != ncols) return 0;
	
	for( int64_t i = 0; i < nrows; i++){
		for(int64_t j = 0; j <= i; j++){
            TVar exp = this->Get(i,j) - this->Get(j,i);
			if ( (REAL)(fabs( exp )) > tol ) {
			  	#ifdef STATE_COMPLEX
				cout << "Elemento: " << i << ", " << j << "  -> " << fabs( exp ) << "/" <<
				this->Get(i,j) << endl;
				#else
				cout << "Elemento: " << i << ", " << j << "  -> " << exp << "/" <<
				this->Get(i,j) << endl;
				#endif
				return 0;
			}
		}
	}
	return 1;
}